

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_30c12::createDFDPackedTest3_FormatRGB565_Test::TestBody
          (createDFDPackedTest3_FormatRGB565_Test *this)

{
  bool bVar1;
  int iVar2;
  AssertHelper *this_00;
  char *in_RDI;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  uint32_t *dfd;
  int channels [4];
  int bits [4];
  AssertHelper *this_01;
  uint *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  int line;
  char *in_stack_ffffffffffffff30;
  Type in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff44;
  ktx_uint8_t in_stack_ffffffffffffff4c;
  ktx_uint8_t in_stack_ffffffffffffff4d;
  ktx_uint8_t in_stack_ffffffffffffff4e;
  ktx_uint8_t in_stack_ffffffffffffff4f;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_stack_ffffffffffffff50;
  initializer_list<(anonymous_namespace)::createDFDTestBase<3U,_2U>::sampleType>
  in_stack_ffffffffffffff60;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff88;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined1 local_48 [48];
  undefined1 *local_18;
  undefined8 local_10;
  
  memcpy(local_48,&DAT_001daef8,0x30);
  local_18 = local_48;
  local_10 = 3;
  this_01 = (AssertHelper *)0x3;
  createDFDTestBaseUncomp<3U,_2U>::customize
            ((createDFDTestBaseUncomp<3U,_2U> *)
             in_stack_ffffffffffffff50._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,in_stack_ffffffffffffff4f,in_stack_ffffffffffffff4e,
             in_stack_ffffffffffffff4d,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff60);
  local_58 = 0x600000005;
  local_50 = 5;
  local_68 = 0x100000002;
  local_60 = 0;
  this_00 = (AssertHelper *)createDFDPacked(0,3,&local_58,&local_68);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_RDI,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(unsigned_long *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff80);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    in_stack_ffffffffffffff20 =
         testing::AssertionResult::failure_message((AssertionResult *)0x14625c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff3c,in_stack_ffffffffffffff30,(int)((ulong)in_RDI >> 0x20),
               in_stack_ffffffffffffff20);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)in_stack_ffffffffffffff88._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper(this_01);
    testing::Message::~Message((Message *)0x1462aa);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1462fd);
  iVar2 = memcmp(in_RDI + 0x10,(void *)((long)&this_00->data_ + 4),0x48);
  uVar3 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_RDI,in_stack_ffffffffffffff20,(int *)in_stack_ffffffffffffff18,(int *)this_01);
  line = (int)((ulong)in_RDI >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff48);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(iVar2,uVar3));
    testing::AssertionResult::failure_message((AssertionResult *)0x146384);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(iVar2,uVar3),in_stack_ffffffffffffff3c,
               in_stack_ffffffffffffff30,line,in_stack_ffffffffffffff20);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)in_stack_ffffffffffffff88._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper(this_01);
    testing::Message::~Message((Message *)0x1463d2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x146422);
  free(this_00);
  return;
}

Assistant:

TEST_F(createDFDPackedTest3, FormatRGB565) {
    customize(KHR_DF_MODEL_RGBSDA, KHR_DF_PRIMARIES_BT709,
              KHR_DF_TRANSFER_LINEAR, KHR_DF_FLAG_ALPHA_STRAIGHT,
              {
                {0, 4, KHR_DF_CHANNEL_RGBSDA_BLUE, 0, 0, 0, 0, 0, 31},
                {5, 5, KHR_DF_CHANNEL_RGBSDA_GREEN, 0, 0, 0, 0, 0, 63},
                {11, 4, KHR_DF_CHANNEL_RGBSDA_RED, 0, 0, 0, 0, 0, 31},
              }
             );

    // In order from LSB.
    int bits[] = {5, 6, 5, 0};
    int channels[] = {
        KHR_DF_CHANNEL_RGBSDA_BLUE,
        KHR_DF_CHANNEL_RGBSDA_GREEN,
        KHR_DF_CHANNEL_RGBSDA_RED,
        0
    };
    uint32_t* dfd = createDFDPacked(KTX_FALSE, 3, bits, channels, s_UNORM);

    EXPECT_EQ(*dfd, sizeof(expected) + 4U);
    EXPECT_EQ(memcmp(&expected, dfd+1, sizeof(expected)), 0);

    free(dfd);
}